

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class2_test_bundle_adjustment.cc
# Opt level: O1

bool calc_cam_poses(Correspondences2D2D *matches,CameraPose *pose1,CameraPose *pose2,float f1,
                   float f2)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int i;
  ulong uVar4;
  double *pdVar5;
  int i_1;
  long lVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  CameraPose *pCVar10;
  bool bVar11;
  undefined1 local_128 [8];
  FundamentalMatrix F;
  EssentialMatrix E;
  vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> poses;
  
  sfm::fundamental_least_squares(matches,(FundamentalMatrix *)local_128);
  sfm::enforce_essential_constraints((FundamentalMatrix *)local_128);
  (pose1->K).m[0] = 0.0;
  (pose1->K).m[1] = 0.0;
  (pose1->K).m[2] = 0.0;
  (pose1->K).m[3] = 0.0;
  (pose1->K).m[4] = 0.0;
  (pose1->K).m[5] = 0.0;
  (pose1->K).m[6] = 0.0;
  (pose1->K).m[7] = 0.0;
  (pose1->K).m[0] = (double)f1;
  (pose1->K).m[2] = 0.0;
  (pose1->K).m[4] = (double)f1;
  (pose1->K).m[5] = 0.0;
  (pose1->K).m[8] = 1.0;
  (pose1->R).m[0] = 0.0;
  (pose1->R).m[1] = 0.0;
  (pose1->R).m[2] = 0.0;
  (pose1->R).m[3] = 0.0;
  (pose1->R).m[4] = 0.0;
  (pose1->R).m[5] = 0.0;
  (pose1->R).m[6] = 0.0;
  (pose1->R).m[7] = 0.0;
  (pose1->R).m[8] = 0.0;
  uVar4 = 0xfffffffffffffffc;
  do {
    (pose1->R).m[uVar4 + 4] = 1.0;
    uVar4 = uVar4 + 4;
  } while (uVar4 < 5);
  (pose1->t).v[0] = 0.0;
  (pose1->t).v[1] = 0.0;
  uVar4 = 0;
  (pose1->t).v[2] = 0.0;
  (pose2->K).m[0] = 0.0;
  (pose2->K).m[1] = 0.0;
  (pose2->K).m[2] = 0.0;
  (pose2->K).m[3] = 0.0;
  (pose2->K).m[4] = 0.0;
  (pose2->K).m[5] = 0.0;
  (pose2->K).m[6] = 0.0;
  (pose2->K).m[7] = 0.0;
  (pose2->K).m[0] = (double)f2;
  (pose2->K).m[2] = 0.0;
  (pose2->K).m[4] = (double)f2;
  (pose2->K).m[5] = 0.0;
  (pose2->K).m[8] = 1.0;
  pdVar5 = (pose2->K).m + 3;
  pCVar10 = pose2;
  do {
    if (uVar4 < 2) {
      lVar6 = 1;
      pdVar8 = pdVar5;
      do {
        dVar1 = (pCVar10->K).m[lVar6];
        (pCVar10->K).m[lVar6] = *pdVar8;
        *pdVar8 = dVar1;
        lVar7 = uVar4 + lVar6;
        lVar6 = lVar6 + 1;
        pdVar8 = pdVar8 + 3;
      } while (lVar7 != 2);
    }
    uVar4 = uVar4 + 1;
    pdVar5 = pdVar5 + 4;
    pCVar10 = (CameraPose *)((pCVar10->K).m + 4);
  } while (uVar4 != 3);
  lVar6 = 0;
  pCVar10 = pose2;
  do {
    lVar7 = 0;
    do {
      pdVar5 = F.m + lVar7 + -1;
      dVar1 = 0.0;
      lVar9 = 0;
      do {
        dVar1 = dVar1 + *(double *)((long)(pCVar10->K).m + lVar9) * *pdVar5;
        lVar9 = lVar9 + 8;
        pdVar5 = pdVar5 + 3;
      } while (lVar9 != 0x18);
      E.m[lVar7 + lVar6 * 3 + 8] = dVar1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    pCVar10 = (CameraPose *)((pCVar10->K).m + 3);
  } while (lVar6 != 3);
  pdVar5 = E.m + 8;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      pdVar8 = (pose1->K).m + lVar7;
      dVar1 = 0.0;
      lVar9 = 0;
      do {
        dVar1 = dVar1 + *(double *)((long)pdVar5 + lVar9) * *pdVar8;
        lVar9 = lVar9 + 8;
        pdVar8 = pdVar8 + 3;
      } while (lVar9 != 0x18);
      F.m[lVar7 + lVar6 * 3 + 8] = dVar1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    pdVar5 = pdVar5 + 3;
  } while (lVar6 != 3);
  E.m[8] = 0.0;
  sfm::pose_from_essential
            ((EssentialMatrix *)(F.m + 8),
             (vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> *)(E.m + 8));
  bVar11 = E.m[8] != 0.0;
  if (bVar11) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      pCVar10 = (CameraPose *)((long)E.m[8] + lVar6);
      memmove(pCVar10,pose2,0x48);
      bVar3 = sfm::is_consistent_pose
                        ((matches->
                         super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>
                         )._M_impl.super__Vector_impl_data._M_start,pose1,pCVar10);
      dVar1 = E.m[8];
      if (bVar3) {
        memmove(pose2,(void *)((long)E.m[8] + lVar6),0x48);
        lVar6 = (long)dVar1 + lVar6;
        memmove(&pose2->R,(void *)(lVar6 + 0x48),0x48);
        dVar1 = *(double *)(lVar6 + 0xa0);
        dVar2 = *(double *)(lVar6 + 0x98);
        (pose2->t).v[0] = *(double *)(lVar6 + 0x90);
        (pose2->t).v[1] = dVar2;
        (pose2->t).v[2] = dVar1;
        break;
      }
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 0xa8;
      bVar11 = uVar4 < (ulong)((-(long)E.m[8] >> 3) * -0x30c30c30c30c30c3);
    } while (bVar11);
  }
  if (E.m[8] != 0.0) {
    operator_delete((void *)E.m[8]);
  }
  return bVar11;
}

Assistant:

bool calc_cam_poses(sfm::Correspondences2D2D const &matches
                  , sfm::CameraPose* pose1
                  , sfm::CameraPose* pose2
                  , float f1
                  , float f2)
{
    // calculate fundamental matrix from  pair correspondences
    sfm::FundamentalMatrix F;
    sfm::fundamental_least_squares(matches, &F);
    sfm::enforce_essential_constraints(&F);

    // 设置相机1的内参矩阵
    pose1->set_k_matrix(f1, 0.0, 0.0);
    // 相机1为参考矩阵，将其姿态设置成单位矩阵
    pose1->init_canonical_form();
    pose2->set_k_matrix(f2, 0.0, 0.0);

    // todo 从本征矩阵中计算本质矩阵
    sfm::EssentialMatrix E = pose2->K.transpose()*F*pose1->K;

    // 从本质矩阵中计算相机姿态,一共有四种情况
    std::vector<sfm::CameraPose> poses;
    sfm::pose_from_essential(E, &poses);

    // 利用匹配点对从4中相机姿态中找到最合适的(利用姿态对匹配点进行三角化得到三维点，计算三维点的相机坐标，
    // 在两个相机的中的z坐标必须为正
    bool found_pose=false;
    for(std::size_t i=0; i< poses.size(); ++i){
        poses[i].K = pose2->K;
        if(sfm::is_consistent_pose(matches[0],*pose1, poses[i]))
        {
            *pose2 = poses[i];
            found_pose = true;
            break;
        }
    }
    return found_pose;
}